

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPoolInline.h
# Opt level: O0

void * sbfPool_get(sbfPool pool)

{
  int *piVar1;
  sbfPoolItem psVar2;
  long in_RDI;
  sbfPoolItem item;
  sbfPool in_stack_fffffffffffffff0;
  
  LOCK();
  piVar1 = (int *)(*(long *)(in_RDI + 0x28) + 0x18);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  psVar2 = sbfPoolNextItem(in_stack_fffffffffffffff0);
  if (psVar2 == (sbfPoolItem)0x0) {
    psVar2 = sbfPoolNew((sbfPool)0x0);
  }
  return psVar2 + 1;
}

Assistant:

static SBF_INLINE void*
sbfPool_get (sbfPool pool)
{
    sbfPoolItem item;

#ifdef WIN32
    InterlockedIncrement (&pool->mCount->mGets);
#else
    __sync_fetch_and_add (&pool->mCount->mGets, 1);
#endif

    item = sbfPoolNextItem (pool);
    if (item == NULL)
        item = sbfPoolNew (pool);
    return item + 1;
}